

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

CharacterCounts __thiscall
ON_XMLNode::WriteToStreamEx
          (ON_XMLNode *this,wchar_t *stream,ON__UINT32 max_chars,bool includeFormatting,
          bool forceLongFormat,bool sortedProperties)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint extraout_var;
  uint extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar4;
  wchar_t *pwVar5;
  uint uVar6;
  wchar_t *pwVar7;
  recursive_mutex *__mutex;
  ulong uVar8;
  CharacterCounts CVar9;
  
  __mutex = &this->_private->m_mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    if (stream == (wchar_t *)0x0 && max_chars != 0) {
      uVar8 = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
                 ,0xd24,"","\'stream\' cannot be null when \'max_chars\' is non-zero");
      uVar4 = 0;
    }
    else {
      iVar1 = (*this->_vptr_ON_XMLNode[0x1d])
                        (this,stream,(ulong)max_chars,(ulong)includeFormatting,
                         (ulong)forceLongFormat);
      pwVar5 = stream + extraout_var;
      if (stream == (wchar_t *)0x0) {
        pwVar5 = (wchar_t *)0x0;
      }
      uVar8 = 0;
      uVar4 = (ulong)(max_chars - iVar1);
      if ((int)(max_chars - iVar1) < 1) {
        uVar4 = uVar8;
      }
      iVar2 = (*this->_vptr_ON_XMLNode[0x1e])
                        (this,pwVar5,uVar4,(ulong)(uint)includeFormatting,(ulong)forceLongFormat,
                         (ulong)sortedProperties);
      pwVar7 = pwVar5 + extraout_var_00;
      if (pwVar5 == (wchar_t *)0x0) {
        pwVar7 = (wchar_t *)0x0;
      }
      uVar6 = (int)uVar4 - iVar2;
      if (0 < (int)uVar6) {
        uVar8 = (ulong)uVar6;
      }
      iVar3 = (*this->_vptr_ON_XMLNode[0x1f])
                        (this,pwVar7,uVar8,(ulong)(uint)includeFormatting,(ulong)forceLongFormat);
      uVar4 = (ulong)(uint)(iVar1 + iVar2 + iVar3);
      uVar8 = ((ulong)(extraout_var_00 + extraout_var) << 0x20) + CONCAT44(extraout_var_01,iVar3) &
              0xffffffff00000000;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    CVar9._reserved = 0;
    CVar9._logical = (int)(uVar8 | uVar4);
    CVar9._physical = (int)((uVar8 | uVar4) >> 0x20);
    return CVar9;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

ON_XMLNode::CharacterCounts ON_XMLNode::WriteToStreamEx(wchar_t* stream, ON__UINT32 max_chars, bool includeFormatting, bool forceLongFormat, bool sortedProperties) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  CharacterCounts counts;

  if ((0 != max_chars) && (nullptr == stream))
  {
    ON_ERROR("'stream' cannot be null when 'max_chars' is non-zero");
    return counts;
  }

  auto cc = WriteHeaderToStream(stream, max_chars, includeFormatting, forceLongFormat, sortedProperties);
  counts += cc;
  if (nullptr != stream)
    stream += cc._physical;

  max_chars = std::max(0, int(max_chars - cc._logical));

  cc = WriteChildrenToStream(stream, max_chars, includeFormatting, forceLongFormat, sortedProperties);
  counts += cc;
  if (nullptr != stream)
    stream += cc._physical;

  max_chars = std::max(0, int(max_chars - cc._logical));

  cc = WriteFooterToStream(stream, max_chars, includeFormatting, forceLongFormat);
  counts += cc;

  return counts;
}